

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void * luaM_growaux_(lua_State *L,void *block,int *size,size_t size_elems,int limit,char *errormsg)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong in_RCX;
  int *in_RDX;
  lua_State *in_RDI;
  int in_R8D;
  char *in_R9;
  int newsize;
  void *newblock;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  int iVar3;
  
  iVar3 = *in_RDX;
  if (iVar3 < in_R8D / 2) {
    in_R8D = *in_RDX << 1;
    if (in_R8D < 4) {
      in_R8D = 4;
    }
  }
  else if (in_R8D <= *in_RDX) {
    luaG_runerror(in_RDI,in_R9,(long)in_R8D % 2 & 0xffffffff);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RCX;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xfffffffffffffffd)) / auVar1,0) <
      (void *)(long)(in_R8D + 1)) {
    pvVar2 = luaM_toobig((lua_State *)0x11689d);
  }
  else {
    pvVar2 = luaM_realloc_((lua_State *)CONCAT44(in_R8D,iVar3),(void *)(long)(in_R8D + 1),
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  *in_RDX = in_R8D;
  return pvVar2;
}

Assistant:

static void*luaM_growaux_(lua_State*L,void*block,int*size,size_t size_elems,
int limit,const char*errormsg){
void*newblock;
int newsize;
if(*size>=limit/2){
if(*size>=limit)
luaG_runerror(L,errormsg);
newsize=limit;
}
else{
newsize=(*size)*2;
if(newsize<4)
newsize=4;
}
newblock=luaM_reallocv(L,block,*size,newsize,size_elems);
*size=newsize;
return newblock;
}